

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_fixedarray(upb_encstate *e,upb_Array *arr,size_t elem_size,uint32_t tag)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined4 in_register_0000000c;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  void *data;
  uint in_R8D;
  
  lVar4 = CONCAT44(in_register_0000000c,tag);
  data = (void *)((ulong)arr & 0xfffffffffffffff8);
  if (in_R8D == 0) {
    encode_bytes(e,data,lVar4 * elem_size);
    return;
  }
  if ((lVar4 != 8) && (lVar4 != 4)) {
    __assert_fail("elem_size == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/wire/encode.c"
                  ,0xce,
                  "void encode_fixedarray(upb_encstate *, const upb_Array *, size_t, uint32_t)");
  }
  lVar6 = (elem_size - 1) * lVar4;
  lVar7 = 0;
  do {
    pcVar3 = e->ptr;
    uVar5 = (long)pcVar3 - (long)e->buf;
    if (lVar4 == 4) {
      uVar1 = *(undefined4 *)((long)data + lVar7 + lVar6);
      if (uVar5 < 4) {
        encode_growbuffer(e,4);
        pcVar3 = e->ptr;
      }
      else {
        pcVar3 = pcVar3 + -4;
        e->ptr = pcVar3;
      }
      *(undefined4 *)pcVar3 = uVar1;
    }
    else {
      uVar2 = *(undefined8 *)((long)data + lVar7 + lVar6);
      if (uVar5 < 8) {
        encode_growbuffer(e,8);
        pcVar3 = e->ptr;
      }
      else {
        pcVar3 = pcVar3 + -8;
        e->ptr = pcVar3;
      }
      *(undefined8 *)pcVar3 = uVar2;
    }
    if ((in_R8D < 0x80) && (pcVar3 = e->ptr, pcVar3 != e->buf)) {
      e->ptr = pcVar3 + -1;
      pcVar3[-1] = (char)in_R8D;
    }
    else {
      encode_longvarint(e,(ulong)in_R8D);
    }
    lVar7 = lVar7 - lVar4;
  } while (-lVar7 != lVar4 * elem_size);
  return;
}

Assistant:

static void encode_fixedarray(upb_encstate* e, const upb_Array* arr,
                              size_t elem_size, uint32_t tag) {
  size_t bytes = upb_Array_Size(arr) * elem_size;
  const char* data = upb_Array_DataPtr(arr);
  const char* ptr = data + bytes - elem_size;

  if (tag || !upb_IsLittleEndian()) {
    while (true) {
      if (elem_size == 4) {
        uint32_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian32(val);
        encode_bytes(e, &val, elem_size);
      } else {
        UPB_ASSERT(elem_size == 8);
        uint64_t val;
        memcpy(&val, ptr, sizeof(val));
        val = upb_BigEndian64(val);
        encode_bytes(e, &val, elem_size);
      }

      if (tag) encode_varint(e, tag);
      if (ptr == data) break;
      ptr -= elem_size;
    }
  } else {
    encode_bytes(e, data, bytes);
  }
}